

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_etc.cpp
# Opt level: O3

bool crnlib::etc1_block::get_diff_subblock_colors
               (color_quad_u8 *pDst,uint16 packed_color5,uint16 packed_delta3,uint table_idx)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uchar uVar8;
  uint uVar9;
  uchar uVar10;
  ulong uVar11;
  color_quad_u8 result;
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 local_2c;
  
  uVar11 = (ulong)table_idx;
  bVar3 = unpack_color5((color_quad_u8 *)&local_2c.field_0,packed_color5,packed_delta3,true,0xff);
  uVar5 = (uint)local_2c.field_0.r;
  uVar4 = (uint)local_2c.field_0.g;
  iVar1 = (&g_etc1_inten_tables)[uVar11 * 4];
  iVar2 = (&DAT_001b7fa4)[uVar11 * 4];
  uVar9 = iVar1 + uVar5;
  uVar7 = iVar1 + uVar4;
  uVar6 = iVar1 + (uint)local_2c.field_0.b;
  uVar10 = 0xff;
  if (uVar9 < 0xff) {
    uVar10 = (uchar)uVar9;
  }
  if ((int)uVar9 < 0) {
    uVar10 = '\0';
  }
  uVar8 = 0xff;
  if (uVar7 < 0xff) {
    uVar8 = (uchar)uVar7;
  }
  (pDst->field_0).field_0.r = uVar10;
  if ((int)uVar7 < 0) {
    uVar8 = '\0';
  }
  uVar9 = 0xff;
  if (uVar6 < 0xff) {
    uVar9 = uVar6;
  }
  (pDst->field_0).field_0.g = uVar8;
  uVar10 = (uchar)uVar9;
  if ((int)uVar6 < 0) {
    uVar10 = '\0';
  }
  (pDst->field_0).field_0.b = uVar10;
  uVar9 = iVar2 + uVar5;
  uVar7 = iVar2 + uVar4;
  uVar6 = iVar2 + (uint)local_2c.field_0.b;
  uVar10 = 0xff;
  if (uVar9 < 0xff) {
    uVar10 = (uchar)uVar9;
  }
  if ((int)uVar9 < 0) {
    uVar10 = '\0';
  }
  uVar8 = 0xff;
  if (uVar7 < 0xff) {
    uVar8 = (uchar)uVar7;
  }
  (pDst->field_0).field_0.a = 0xff;
  if ((int)uVar7 < 0) {
    uVar8 = '\0';
  }
  uVar9 = 0xff;
  if (uVar6 < 0xff) {
    uVar9 = uVar6;
  }
  pDst[1].field_0.field_0.r = uVar10;
  uVar10 = (uchar)uVar9;
  if ((int)uVar6 < 0) {
    uVar10 = '\0';
  }
  pDst[1].field_0.field_0.g = uVar8;
  pDst[1].field_0.field_0.b = uVar10;
  pDst[1].field_0.field_0.a = 0xff;
  iVar1 = *(int *)(&DAT_001b7fa8 + uVar11 * 0x10);
  uVar9 = iVar1 + uVar5;
  uVar7 = iVar1 + uVar4;
  uVar6 = iVar1 + (uint)local_2c.field_0.b;
  uVar10 = 0xff;
  if (uVar9 < 0xff) {
    uVar10 = (uchar)uVar9;
  }
  if ((int)uVar9 < 0) {
    uVar10 = '\0';
  }
  pDst[2].field_0.field_0.r = uVar10;
  uVar10 = 0xff;
  if (uVar7 < 0xff) {
    uVar10 = (uchar)uVar7;
  }
  if ((int)uVar7 < 0) {
    uVar10 = '\0';
  }
  pDst[2].field_0.field_0.g = uVar10;
  uVar9 = 0xff;
  if (uVar6 < 0xff) {
    uVar9 = uVar6;
  }
  uVar10 = (uchar)uVar9;
  if ((int)uVar6 < 0) {
    uVar10 = '\0';
  }
  pDst[2].field_0.field_0.b = uVar10;
  pDst[2].field_0.field_0.a = 0xff;
  iVar1 = *(int *)(&DAT_001b7fac + uVar11 * 0x10);
  uVar5 = uVar5 + iVar1;
  uVar4 = uVar4 + iVar1;
  uVar7 = iVar1 + (uint)local_2c.field_0.b;
  uVar9 = 0xff;
  if (uVar5 < 0xff) {
    uVar9 = uVar5;
  }
  uVar10 = (uchar)uVar9;
  if ((int)uVar5 < 0) {
    uVar10 = '\0';
  }
  uVar9 = 0xff;
  if (uVar4 < 0xff) {
    uVar9 = uVar4;
  }
  uVar8 = (uchar)uVar9;
  if ((int)uVar4 < 0) {
    uVar8 = '\0';
  }
  uVar9 = 0xff;
  if (uVar7 < 0xff) {
    uVar9 = uVar7;
  }
  pDst[3].field_0.field_0.r = uVar10;
  uVar10 = (uchar)uVar9;
  if ((int)uVar7 < 0) {
    uVar10 = '\0';
  }
  pDst[3].field_0.field_0.g = uVar8;
  pDst[3].field_0.field_0.b = uVar10;
  pDst[3].field_0.field_0.a = 0xff;
  return bVar3;
}

Assistant:

bool etc1_block::get_diff_subblock_colors(color_quad_u8* pDst, uint16 packed_color5, uint16 packed_delta3, uint table_idx) {
  CRNLIB_ASSERT(table_idx < cETC1IntenModifierValues);
  const int* pInten_modifer_table = &g_etc1_inten_tables[table_idx][0];

  uint r, g, b;
  bool success = unpack_color5(r, g, b, packed_color5, packed_delta3, true);

  const int ir = static_cast<int>(r), ig = static_cast<int>(g), ib = static_cast<int>(b);

  const int y0 = pInten_modifer_table[0];
  pDst[0].set(ir + y0, ig + y0, ib + y0);

  const int y1 = pInten_modifer_table[1];
  pDst[1].set(ir + y1, ig + y1, ib + y1);

  const int y2 = pInten_modifer_table[2];
  pDst[2].set(ir + y2, ig + y2, ib + y2);

  const int y3 = pInten_modifer_table[3];
  pDst[3].set(ir + y3, ig + y3, ib + y3);

  return success;
}